

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

fnet_socket_t fnet_socket_accept(fnet_socket_t sock,fnet_address_t *addr)

{
  fnet_socket_t fVar1;
  socklen_t *__addr_len;
  socklen_t addr_len;
  socklen_t local_4;
  
  __addr_len = &local_4;
  if (addr == (fnet_address_t *)0x0) {
    __addr_len = (socklen_t *)0x0;
  }
  fVar1 = accept(sock,(sockaddr *)addr,__addr_len);
  return fVar1;
}

Assistant:

fnet_socket_t fnet_socket_accept(fnet_socket_t sock, fnet_address_t *addr)
{
    socklen_t addr_len = sizeof(fnet_address_t);
    int client_sock = accept((int)sock, (struct sockaddr *)addr, addr ? &addr_len : 0);
    if (client_sock == -1)
        return FNET_INVALID_SOCKET;
    return (fnet_socket_t)client_sock;
}